

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
          (QVLABase<QLocaleId> *this,qsizetype prealloc,void *array,QLocaleId *args)

{
  qsizetype *pqVar1;
  reference pvVar2;
  ushort uVar3;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 6);
  pvVar2->territory_id = args->territory_id;
  uVar3 = args->script_id;
  pvVar2->language_id = args->language_id;
  pvVar2->script_id = uVar3;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pvVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }